

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# object.cpp
# Opt level: O3

void __thiscall ObjectTest_basic_set_Test::TestBody(ObjectTest_basic_set_Test *this)

{
  longdouble lVar1;
  anon_union_16_2_edb7204a_for_basic_string<char8_t,_std::char_traits<char8_t>,_std::allocator<char8_t>_>_11
  *paVar2;
  anon_union_16_2_edb7204a_for_basic_string<char8_t,_std::char_traits<char8_t>,_std::allocator<char8_t>_>_11
  *paVar3;
  long *plVar4;
  undefined1 *puVar5;
  long lVar6;
  double dVar7;
  internal iVar8;
  undefined1 uVar9;
  Message MVar10;
  undefined1 uVar11;
  undefined2 uVar12;
  undefined4 uVar13;
  undefined1 uVar14;
  undefined1 uVar15;
  undefined2 uVar16;
  undefined4 uVar17;
  undefined2 uVar18;
  undefined4 uVar19;
  undefined8 uVar20;
  char *pcVar21;
  pointer *__ptr;
  longdouble lVar22;
  float fVar23;
  object obj;
  undefined1 local_e8 [8];
  undefined2 uStack_e0;
  undefined6 uStack_de;
  anon_union_16_2_edb7204a_for_basic_string<char8_t,_std::char_traits<char8_t>,_std::allocator<char8_t>_>_11
  local_d8;
  undefined1 local_c8 [8];
  undefined2 uStack_c0;
  undefined6 uStack_be;
  undefined1 local_b8;
  undefined7 uStack_b7;
  undefined4 uStack_af;
  undefined2 uStack_ab;
  char8_t cStack_a9;
  AssertHelper local_a8 [8];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_a0;
  basic_string<char8_t,_std::char_traits<char8_t>,_std::allocator<char8_t>_> local_98;
  _Variadic_union<void_*,_bool,_long,_long_double,_std::__cxx11::basic_string<char8_t,_std::char_traits<char8_t>,_std::allocator<char8_t>_>,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::vector<jessilib::object,_std::allocator<jessilib::object>_>,_std::map<std::__cxx11::basic_string<char8_t,_std::char_traits<char8_t>,_std::allocator<char8_t>_>,_jessilib::object,_std::less<std::__cxx11::basic_string<char8_t,_std::char_traits<char8_t>,_std::allocator<char8_t>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char8_t,_std::char_traits<char8_t>,_std::allocator<char8_t>_>,_jessilib::object>_>_>_>
  local_78;
  char local_48;
  float local_34;
  double local_30;
  
  local_78._0_2_ = 0;
  local_78._2_2_ = 0;
  local_78._4_4_ = 0;
  local_48 = '\0';
  local_e8[0] = (internal)0x0;
  std::
  variant<void*,bool,long,long_double,std::__cxx11::u8string,std::vector<unsigned_char,std::allocator<unsigned_char>>,std::vector<jessilib::object,std::allocator<jessilib::object>>,std::map<std::__cxx11::u8string,jessilib::object,std::less<std::__cxx11::u8string>,std::allocator<std::pair<std::__cxx11::u8string_const,jessilib::object>>>>
  ::emplace<1ul,bool&>
            ((variant<void*,bool,long,long_double,std::__cxx11::u8string,std::vector<unsigned_char,std::allocator<unsigned_char>>,std::vector<jessilib::object,std::allocator<jessilib::object>>,std::map<std::__cxx11::u8string,jessilib::object,std::less<std::__cxx11::u8string>,std::allocator<std::pair<std::__cxx11::u8string_const,jessilib::object>>>>
              *)&local_78._M_first,(bool *)local_e8);
  local_c8[0] = (Message)(local_48 == '\x01');
  uStack_c0 = 0;
  uStack_be = 0;
  if (!(bool)local_c8[0]) {
    testing::Message::Message((Message *)&local_98);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((AssertionResult *)local_e8,local_c8,"obj .has< bool >()","false");
    testing::internal::AssertHelper::AssertHelper
              (local_a8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/JAJames[P]Jupiter-Bot/src/Jupiter/src/jessilib/src/test/object.cpp"
               ,0x1ee,(char *)CONCAT44(local_e8._4_4_,
                                       CONCAT22(local_e8._2_2_,CONCAT11(local_e8[1],local_e8[0]))));
    testing::internal::AssertHelper::operator=(local_a8,(Message *)&local_98);
    testing::internal::AssertHelper::~AssertHelper(local_a8);
    paVar2 = (anon_union_16_2_edb7204a_for_basic_string<char8_t,_std::char_traits<char8_t>,_std::allocator<char8_t>_>_11
              *)CONCAT44(local_e8._4_4_,CONCAT22(local_e8._2_2_,CONCAT11(local_e8[1],local_e8[0])));
    if (paVar2 != &local_d8) {
      operator_delete(paVar2,CONCAT71(local_d8._M_allocated_capacity._1_7_,local_d8._M_local_buf[0])
                             + 1);
    }
    plVar4 = (long *)CONCAT44(local_98._M_dataplus._M_p._4_4_,
                              CONCAT22(local_98._M_dataplus._M_p._2_2_,
                                       CONCAT11(local_98._M_dataplus._M_p._1_1_,
                                                local_98._M_dataplus._M_p._0_1_)));
    if (plVar4 != (long *)0x0) {
      (**(code **)(*plVar4 + 8))();
    }
    if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
        CONCAT62(uStack_be,uStack_c0) !=
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      std::
      default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    *)&uStack_c0,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   CONCAT62(uStack_be,uStack_c0));
    }
  }
  local_c8[0] = (Message)0x0;
  if (local_48 == '\x01') {
    local_c8[0] = SUB21(local_78._0_2_,0);
  }
  local_98._M_dataplus._M_p._0_1_ = 0;
  testing::internal::CmpHelperEQ<bool,bool>
            ((internal *)local_e8,"obj .get< bool >()","bool {}",(bool *)local_c8,(bool *)&local_98)
  ;
  if (local_e8[0] == (internal)0x0) {
    testing::Message::Message((Message *)local_c8);
    if ((undefined8 *)CONCAT62(uStack_de,uStack_e0) == (undefined8 *)0x0) {
      pcVar21 = "";
    }
    else {
      pcVar21 = *(char **)CONCAT62(uStack_de,uStack_e0);
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_98,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/JAJames[P]Jupiter-Bot/src/Jupiter/src/jessilib/src/test/object.cpp"
               ,0x1ee,pcVar21);
    testing::internal::AssertHelper::operator=((AssertHelper *)&local_98,(Message *)local_c8);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_98);
    plVar4 = (long *)CONCAT44(local_c8._4_4_,
                              CONCAT22(local_c8._2_2_,CONCAT11(local_c8[1],local_c8[0])));
    if (plVar4 != (long *)0x0) {
      (**(code **)(*plVar4 + 8))();
    }
  }
  if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
      CONCAT62(uStack_de,uStack_e0) !=
      (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&uStack_e0,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 CONCAT62(uStack_de,uStack_e0));
  }
  local_e8[0] = (internal)0x0;
  std::
  variant<void*,bool,long,long_double,std::__cxx11::u8string,std::vector<unsigned_char,std::allocator<unsigned_char>>,std::vector<jessilib::object,std::allocator<jessilib::object>>,std::map<std::__cxx11::u8string,jessilib::object,std::less<std::__cxx11::u8string>,std::allocator<std::pair<std::__cxx11::u8string_const,jessilib::object>>>>
  ::emplace<2ul,signed_char&>
            ((variant<void*,bool,long,long_double,std::__cxx11::u8string,std::vector<unsigned_char,std::allocator<unsigned_char>>,std::vector<jessilib::object,std::allocator<jessilib::object>>,std::map<std::__cxx11::u8string,jessilib::object,std::less<std::__cxx11::u8string>,std::allocator<std::pair<std::__cxx11::u8string_const,jessilib::object>>>>
              *)&local_78._M_first,local_e8);
  local_c8[0] = (Message)(local_48 == '\x02');
  uStack_c0 = 0;
  uStack_be = 0;
  if (!(bool)local_c8[0]) {
    testing::Message::Message((Message *)&local_98);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((AssertionResult *)local_e8,local_c8,"obj .has< signed_char_t >()","false");
    testing::internal::AssertHelper::AssertHelper
              (local_a8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/JAJames[P]Jupiter-Bot/src/Jupiter/src/jessilib/src/test/object.cpp"
               ,0x1ef,(char *)CONCAT44(local_e8._4_4_,
                                       CONCAT22(local_e8._2_2_,CONCAT11(local_e8[1],local_e8[0]))));
    testing::internal::AssertHelper::operator=(local_a8,(Message *)&local_98);
    testing::internal::AssertHelper::~AssertHelper(local_a8);
    paVar2 = (anon_union_16_2_edb7204a_for_basic_string<char8_t,_std::char_traits<char8_t>,_std::allocator<char8_t>_>_11
              *)CONCAT44(local_e8._4_4_,CONCAT22(local_e8._2_2_,CONCAT11(local_e8[1],local_e8[0])));
    if (paVar2 != &local_d8) {
      operator_delete(paVar2,CONCAT71(local_d8._M_allocated_capacity._1_7_,local_d8._M_local_buf[0])
                             + 1);
    }
    plVar4 = (long *)CONCAT44(local_98._M_dataplus._M_p._4_4_,
                              CONCAT22(local_98._M_dataplus._M_p._2_2_,
                                       CONCAT11(local_98._M_dataplus._M_p._1_1_,
                                                local_98._M_dataplus._M_p._0_1_)));
    if (plVar4 != (long *)0x0) {
      (**(code **)(*plVar4 + 8))();
    }
    if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
        CONCAT62(uStack_be,uStack_c0) !=
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      std::
      default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    *)&uStack_c0,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   CONCAT62(uStack_be,uStack_c0));
    }
  }
  local_c8[0] = (Message)0x0;
  if (local_48 == '\x02') {
    local_c8[0] = SUB21(local_78._0_2_,0);
  }
  local_98._M_dataplus._M_p._0_1_ = 0;
  testing::internal::CmpHelperEQ<signed_char,signed_char>
            ((internal *)local_e8,"obj .get< signed_char_t >()","signed_char_t {}",local_c8,
             (char *)&local_98);
  if (local_e8[0] == (internal)0x0) {
    testing::Message::Message((Message *)local_c8);
    if ((undefined8 *)CONCAT62(uStack_de,uStack_e0) == (undefined8 *)0x0) {
      pcVar21 = "";
    }
    else {
      pcVar21 = *(char **)CONCAT62(uStack_de,uStack_e0);
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_98,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/JAJames[P]Jupiter-Bot/src/Jupiter/src/jessilib/src/test/object.cpp"
               ,0x1ef,pcVar21);
    testing::internal::AssertHelper::operator=((AssertHelper *)&local_98,(Message *)local_c8);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_98);
    plVar4 = (long *)CONCAT44(local_c8._4_4_,
                              CONCAT22(local_c8._2_2_,CONCAT11(local_c8[1],local_c8[0])));
    if (plVar4 != (long *)0x0) {
      (**(code **)(*plVar4 + 8))();
    }
  }
  if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
      CONCAT62(uStack_de,uStack_e0) !=
      (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&uStack_e0,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 CONCAT62(uStack_de,uStack_e0));
  }
  local_e8[0] = (internal)0x0;
  std::
  variant<void*,bool,long,long_double,std::__cxx11::u8string,std::vector<unsigned_char,std::allocator<unsigned_char>>,std::vector<jessilib::object,std::allocator<jessilib::object>>,std::map<std::__cxx11::u8string,jessilib::object,std::less<std::__cxx11::u8string>,std::allocator<std::pair<std::__cxx11::u8string_const,jessilib::object>>>>
  ::emplace<2ul,unsigned_char&>
            ((variant<void*,bool,long,long_double,std::__cxx11::u8string,std::vector<unsigned_char,std::allocator<unsigned_char>>,std::vector<jessilib::object,std::allocator<jessilib::object>>,std::map<std::__cxx11::u8string,jessilib::object,std::less<std::__cxx11::u8string>,std::allocator<std::pair<std::__cxx11::u8string_const,jessilib::object>>>>
              *)&local_78._M_first,local_e8);
  local_c8[0] = (Message)(local_48 == '\x02');
  uStack_c0 = 0;
  uStack_be = 0;
  if (!(bool)local_c8[0]) {
    testing::Message::Message((Message *)&local_98);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((AssertionResult *)local_e8,local_c8,"obj .has< unsigned_char_t >()","false");
    testing::internal::AssertHelper::AssertHelper
              (local_a8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/JAJames[P]Jupiter-Bot/src/Jupiter/src/jessilib/src/test/object.cpp"
               ,0x1f0,(char *)CONCAT44(local_e8._4_4_,
                                       CONCAT22(local_e8._2_2_,CONCAT11(local_e8[1],local_e8[0]))));
    testing::internal::AssertHelper::operator=(local_a8,(Message *)&local_98);
    testing::internal::AssertHelper::~AssertHelper(local_a8);
    paVar2 = (anon_union_16_2_edb7204a_for_basic_string<char8_t,_std::char_traits<char8_t>,_std::allocator<char8_t>_>_11
              *)CONCAT44(local_e8._4_4_,CONCAT22(local_e8._2_2_,CONCAT11(local_e8[1],local_e8[0])));
    if (paVar2 != &local_d8) {
      operator_delete(paVar2,CONCAT71(local_d8._M_allocated_capacity._1_7_,local_d8._M_local_buf[0])
                             + 1);
    }
    plVar4 = (long *)CONCAT44(local_98._M_dataplus._M_p._4_4_,
                              CONCAT22(local_98._M_dataplus._M_p._2_2_,
                                       CONCAT11(local_98._M_dataplus._M_p._1_1_,
                                                local_98._M_dataplus._M_p._0_1_)));
    if (plVar4 != (long *)0x0) {
      (**(code **)(*plVar4 + 8))();
    }
    if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
        CONCAT62(uStack_be,uStack_c0) !=
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      std::
      default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    *)&uStack_c0,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   CONCAT62(uStack_be,uStack_c0));
    }
  }
  local_c8[0] = (Message)0x0;
  if (local_48 == '\x02') {
    local_c8[0] = SUB21(local_78._0_2_,0);
  }
  local_98._M_dataplus._M_p._0_1_ = 0;
  testing::internal::CmpHelperEQ<unsigned_char,unsigned_char>
            ((internal *)local_e8,"obj .get< unsigned_char_t >()","unsigned_char_t {}",local_c8,
             (uchar *)&local_98);
  if (local_e8[0] == (internal)0x0) {
    testing::Message::Message((Message *)local_c8);
    if ((undefined8 *)CONCAT62(uStack_de,uStack_e0) == (undefined8 *)0x0) {
      pcVar21 = "";
    }
    else {
      pcVar21 = *(char **)CONCAT62(uStack_de,uStack_e0);
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_98,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/JAJames[P]Jupiter-Bot/src/Jupiter/src/jessilib/src/test/object.cpp"
               ,0x1f0,pcVar21);
    testing::internal::AssertHelper::operator=((AssertHelper *)&local_98,(Message *)local_c8);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_98);
    plVar4 = (long *)CONCAT44(local_c8._4_4_,
                              CONCAT22(local_c8._2_2_,CONCAT11(local_c8[1],local_c8[0])));
    if (plVar4 != (long *)0x0) {
      (**(code **)(*plVar4 + 8))();
    }
  }
  if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
      CONCAT62(uStack_de,uStack_e0) !=
      (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&uStack_e0,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 CONCAT62(uStack_de,uStack_e0));
  }
  local_e8[0] = (internal)0x0;
  local_e8[1] = 0;
  std::
  variant<void*,bool,long,long_double,std::__cxx11::u8string,std::vector<unsigned_char,std::allocator<unsigned_char>>,std::vector<jessilib::object,std::allocator<jessilib::object>>,std::map<std::__cxx11::u8string,jessilib::object,std::less<std::__cxx11::u8string>,std::allocator<std::pair<std::__cxx11::u8string_const,jessilib::object>>>>
  ::emplace<2ul,short&>
            ((variant<void*,bool,long,long_double,std::__cxx11::u8string,std::vector<unsigned_char,std::allocator<unsigned_char>>,std::vector<jessilib::object,std::allocator<jessilib::object>>,std::map<std::__cxx11::u8string,jessilib::object,std::less<std::__cxx11::u8string>,std::allocator<std::pair<std::__cxx11::u8string_const,jessilib::object>>>>
              *)&local_78._M_first,(short *)local_e8);
  local_c8[0] = (Message)(local_48 == '\x02');
  uStack_c0 = 0;
  uStack_be = 0;
  if (!(bool)local_c8[0]) {
    testing::Message::Message((Message *)&local_98);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((AssertionResult *)local_e8,local_c8,"obj .has< short >()","false");
    testing::internal::AssertHelper::AssertHelper
              (local_a8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/JAJames[P]Jupiter-Bot/src/Jupiter/src/jessilib/src/test/object.cpp"
               ,0x1f1,(char *)CONCAT44(local_e8._4_4_,
                                       CONCAT22(local_e8._2_2_,CONCAT11(local_e8[1],local_e8[0]))));
    testing::internal::AssertHelper::operator=(local_a8,(Message *)&local_98);
    testing::internal::AssertHelper::~AssertHelper(local_a8);
    paVar2 = (anon_union_16_2_edb7204a_for_basic_string<char8_t,_std::char_traits<char8_t>,_std::allocator<char8_t>_>_11
              *)CONCAT44(local_e8._4_4_,CONCAT22(local_e8._2_2_,CONCAT11(local_e8[1],local_e8[0])));
    if (paVar2 != &local_d8) {
      operator_delete(paVar2,CONCAT71(local_d8._M_allocated_capacity._1_7_,local_d8._M_local_buf[0])
                             + 1);
    }
    plVar4 = (long *)CONCAT44(local_98._M_dataplus._M_p._4_4_,
                              CONCAT22(local_98._M_dataplus._M_p._2_2_,
                                       CONCAT11(local_98._M_dataplus._M_p._1_1_,
                                                local_98._M_dataplus._M_p._0_1_)));
    if (plVar4 != (long *)0x0) {
      (**(code **)(*plVar4 + 8))();
    }
    if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
        CONCAT62(uStack_be,uStack_c0) !=
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      std::
      default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    *)&uStack_c0,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   CONCAT62(uStack_be,uStack_c0));
    }
  }
  uVar18 = local_78._0_2_;
  if (local_48 != '\x02') {
    uVar18 = 0;
  }
  local_c8[0] = SUB21(uVar18,0);
  local_c8[1] = (undefined1)((ushort)uVar18 >> 8);
  local_98._M_dataplus._M_p._0_1_ = 0;
  local_98._M_dataplus._M_p._1_1_ = 0;
  testing::internal::CmpHelperEQ<short,short>
            ((internal *)local_e8,"obj .get< short >()","short {}",(short *)local_c8,
             (short *)&local_98);
  if (local_e8[0] == (internal)0x0) {
    testing::Message::Message((Message *)local_c8);
    if ((undefined8 *)CONCAT62(uStack_de,uStack_e0) == (undefined8 *)0x0) {
      pcVar21 = "";
    }
    else {
      pcVar21 = *(char **)CONCAT62(uStack_de,uStack_e0);
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_98,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/JAJames[P]Jupiter-Bot/src/Jupiter/src/jessilib/src/test/object.cpp"
               ,0x1f1,pcVar21);
    testing::internal::AssertHelper::operator=((AssertHelper *)&local_98,(Message *)local_c8);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_98);
    plVar4 = (long *)CONCAT44(local_c8._4_4_,
                              CONCAT22(local_c8._2_2_,CONCAT11(local_c8[1],local_c8[0])));
    if (plVar4 != (long *)0x0) {
      (**(code **)(*plVar4 + 8))();
    }
  }
  if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
      CONCAT62(uStack_de,uStack_e0) !=
      (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&uStack_e0,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 CONCAT62(uStack_de,uStack_e0));
  }
  local_e8[0] = (internal)0x0;
  local_e8[1] = 0;
  local_e8._2_2_ = 0;
  std::
  variant<void*,bool,long,long_double,std::__cxx11::u8string,std::vector<unsigned_char,std::allocator<unsigned_char>>,std::vector<jessilib::object,std::allocator<jessilib::object>>,std::map<std::__cxx11::u8string,jessilib::object,std::less<std::__cxx11::u8string>,std::allocator<std::pair<std::__cxx11::u8string_const,jessilib::object>>>>
  ::emplace<2ul,int&>((variant<void*,bool,long,long_double,std::__cxx11::u8string,std::vector<unsigned_char,std::allocator<unsigned_char>>,std::vector<jessilib::object,std::allocator<jessilib::object>>,std::map<std::__cxx11::u8string,jessilib::object,std::less<std::__cxx11::u8string>,std::allocator<std::pair<std::__cxx11::u8string_const,jessilib::object>>>>
                       *)&local_78._M_first,(int *)local_e8);
  local_c8[0] = (Message)(local_48 == '\x02');
  uStack_c0 = 0;
  uStack_be = 0;
  if (!(bool)local_c8[0]) {
    testing::Message::Message((Message *)&local_98);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((AssertionResult *)local_e8,local_c8,"obj .has< int >()","false");
    testing::internal::AssertHelper::AssertHelper
              (local_a8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/JAJames[P]Jupiter-Bot/src/Jupiter/src/jessilib/src/test/object.cpp"
               ,0x1f2,(char *)CONCAT44(local_e8._4_4_,
                                       CONCAT22(local_e8._2_2_,CONCAT11(local_e8[1],local_e8[0]))));
    testing::internal::AssertHelper::operator=(local_a8,(Message *)&local_98);
    testing::internal::AssertHelper::~AssertHelper(local_a8);
    paVar2 = (anon_union_16_2_edb7204a_for_basic_string<char8_t,_std::char_traits<char8_t>,_std::allocator<char8_t>_>_11
              *)CONCAT44(local_e8._4_4_,CONCAT22(local_e8._2_2_,CONCAT11(local_e8[1],local_e8[0])));
    if (paVar2 != &local_d8) {
      operator_delete(paVar2,CONCAT71(local_d8._M_allocated_capacity._1_7_,local_d8._M_local_buf[0])
                             + 1);
    }
    plVar4 = (long *)CONCAT44(local_98._M_dataplus._M_p._4_4_,
                              CONCAT22(local_98._M_dataplus._M_p._2_2_,
                                       CONCAT11(local_98._M_dataplus._M_p._1_1_,
                                                local_98._M_dataplus._M_p._0_1_)));
    if (plVar4 != (long *)0x0) {
      (**(code **)(*plVar4 + 8))();
    }
    if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
        CONCAT62(uStack_be,uStack_c0) !=
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      std::
      default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    *)&uStack_c0,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   CONCAT62(uStack_be,uStack_c0));
    }
  }
  uVar19 = 0;
  if (local_48 == '\x02') {
    uVar19 = CONCAT22(local_78._2_2_,local_78._0_2_);
  }
  local_c8[0] = SUB41(uVar19,0);
  local_c8[1] = (undefined1)((uint)uVar19 >> 8);
  local_c8._2_2_ = (undefined2)((uint)uVar19 >> 0x10);
  local_98._M_dataplus._M_p._0_1_ = 0;
  local_98._M_dataplus._M_p._1_1_ = 0;
  local_98._M_dataplus._M_p._2_2_ = 0;
  testing::internal::CmpHelperEQ<int,int>
            ((internal *)local_e8,"obj .get< int >()","int {}",(int *)local_c8,(int *)&local_98);
  if (local_e8[0] == (internal)0x0) {
    testing::Message::Message((Message *)local_c8);
    if ((undefined8 *)CONCAT62(uStack_de,uStack_e0) == (undefined8 *)0x0) {
      pcVar21 = "";
    }
    else {
      pcVar21 = *(char **)CONCAT62(uStack_de,uStack_e0);
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_98,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/JAJames[P]Jupiter-Bot/src/Jupiter/src/jessilib/src/test/object.cpp"
               ,0x1f2,pcVar21);
    testing::internal::AssertHelper::operator=((AssertHelper *)&local_98,(Message *)local_c8);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_98);
    plVar4 = (long *)CONCAT44(local_c8._4_4_,
                              CONCAT22(local_c8._2_2_,CONCAT11(local_c8[1],local_c8[0])));
    if (plVar4 != (long *)0x0) {
      (**(code **)(*plVar4 + 8))();
    }
  }
  if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
      CONCAT62(uStack_de,uStack_e0) !=
      (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&uStack_e0,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 CONCAT62(uStack_de,uStack_e0));
  }
  local_e8[0] = (internal)0x0;
  local_e8[1] = 0;
  local_e8._2_2_ = 0;
  local_e8._4_4_ = 0;
  std::
  variant<void*,bool,long,long_double,std::__cxx11::u8string,std::vector<unsigned_char,std::allocator<unsigned_char>>,std::vector<jessilib::object,std::allocator<jessilib::object>>,std::map<std::__cxx11::u8string,jessilib::object,std::less<std::__cxx11::u8string>,std::allocator<std::pair<std::__cxx11::u8string_const,jessilib::object>>>>
  ::emplace<2ul,long&>
            ((variant<void*,bool,long,long_double,std::__cxx11::u8string,std::vector<unsigned_char,std::allocator<unsigned_char>>,std::vector<jessilib::object,std::allocator<jessilib::object>>,std::map<std::__cxx11::u8string,jessilib::object,std::less<std::__cxx11::u8string>,std::allocator<std::pair<std::__cxx11::u8string_const,jessilib::object>>>>
              *)&local_78._M_first,(long *)local_e8);
  local_c8[0] = (Message)(local_48 == '\x02');
  uStack_c0 = 0;
  uStack_be = 0;
  if (!(bool)local_c8[0]) {
    testing::Message::Message((Message *)&local_98);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((AssertionResult *)local_e8,local_c8,"obj .has< long >()","false");
    testing::internal::AssertHelper::AssertHelper
              (local_a8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/JAJames[P]Jupiter-Bot/src/Jupiter/src/jessilib/src/test/object.cpp"
               ,499,(char *)CONCAT44(local_e8._4_4_,
                                     CONCAT22(local_e8._2_2_,CONCAT11(local_e8[1],local_e8[0]))));
    testing::internal::AssertHelper::operator=(local_a8,(Message *)&local_98);
    testing::internal::AssertHelper::~AssertHelper(local_a8);
    paVar2 = (anon_union_16_2_edb7204a_for_basic_string<char8_t,_std::char_traits<char8_t>,_std::allocator<char8_t>_>_11
              *)CONCAT44(local_e8._4_4_,CONCAT22(local_e8._2_2_,CONCAT11(local_e8[1],local_e8[0])));
    if (paVar2 != &local_d8) {
      operator_delete(paVar2,CONCAT71(local_d8._M_allocated_capacity._1_7_,local_d8._M_local_buf[0])
                             + 1);
    }
    plVar4 = (long *)CONCAT44(local_98._M_dataplus._M_p._4_4_,
                              CONCAT22(local_98._M_dataplus._M_p._2_2_,
                                       CONCAT11(local_98._M_dataplus._M_p._1_1_,
                                                local_98._M_dataplus._M_p._0_1_)));
    if (plVar4 != (long *)0x0) {
      (**(code **)(*plVar4 + 8))();
    }
    if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
        CONCAT62(uStack_be,uStack_c0) !=
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      std::
      default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    *)&uStack_c0,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   CONCAT62(uStack_be,uStack_c0));
    }
  }
  if (local_48 == '\x02') {
    uVar20 = CONCAT44(local_78._4_4_,CONCAT22(local_78._2_2_,local_78._0_2_));
  }
  else {
    uVar20 = 0;
  }
  local_c8[0] = SUB81(uVar20,0);
  local_c8[1] = (undefined1)((ulong)uVar20 >> 8);
  local_c8._2_2_ = (undefined2)((ulong)uVar20 >> 0x10);
  local_c8._4_4_ = (undefined4)((ulong)uVar20 >> 0x20);
  local_98._M_dataplus._M_p._0_1_ = 0;
  local_98._M_dataplus._M_p._1_1_ = 0;
  local_98._M_dataplus._M_p._2_2_ = 0;
  local_98._M_dataplus._M_p._4_4_ = 0;
  testing::internal::CmpHelperEQ<long,long>
            ((internal *)local_e8,"obj .get< long >()","long {}",(long *)local_c8,(long *)&local_98)
  ;
  if (local_e8[0] == (internal)0x0) {
    testing::Message::Message((Message *)local_c8);
    if ((undefined8 *)CONCAT62(uStack_de,uStack_e0) == (undefined8 *)0x0) {
      pcVar21 = "";
    }
    else {
      pcVar21 = *(char **)CONCAT62(uStack_de,uStack_e0);
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_98,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/JAJames[P]Jupiter-Bot/src/Jupiter/src/jessilib/src/test/object.cpp"
               ,499,pcVar21);
    testing::internal::AssertHelper::operator=((AssertHelper *)&local_98,(Message *)local_c8);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_98);
    plVar4 = (long *)CONCAT44(local_c8._4_4_,
                              CONCAT22(local_c8._2_2_,CONCAT11(local_c8[1],local_c8[0])));
    if (plVar4 != (long *)0x0) {
      (**(code **)(*plVar4 + 8))();
    }
  }
  if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
      CONCAT62(uStack_de,uStack_e0) !=
      (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&uStack_e0,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 CONCAT62(uStack_de,uStack_e0));
  }
  local_e8[0] = (internal)0x0;
  local_e8[1] = 0;
  local_e8._2_2_ = 0;
  local_e8._4_4_ = 0;
  std::
  variant<void*,bool,long,long_double,std::__cxx11::u8string,std::vector<unsigned_char,std::allocator<unsigned_char>>,std::vector<jessilib::object,std::allocator<jessilib::object>>,std::map<std::__cxx11::u8string,jessilib::object,std::less<std::__cxx11::u8string>,std::allocator<std::pair<std::__cxx11::u8string_const,jessilib::object>>>>
  ::emplace<2ul,long_long&>
            ((variant<void*,bool,long,long_double,std::__cxx11::u8string,std::vector<unsigned_char,std::allocator<unsigned_char>>,std::vector<jessilib::object,std::allocator<jessilib::object>>,std::map<std::__cxx11::u8string,jessilib::object,std::less<std::__cxx11::u8string>,std::allocator<std::pair<std::__cxx11::u8string_const,jessilib::object>>>>
              *)&local_78._M_first,(longlong *)local_e8);
  local_c8[0] = (Message)(local_48 == '\x02');
  uStack_c0 = 0;
  uStack_be = 0;
  if (!(bool)local_c8[0]) {
    testing::Message::Message((Message *)&local_98);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((AssertionResult *)local_e8,local_c8,"obj .has< long_long_t >()","false");
    testing::internal::AssertHelper::AssertHelper
              (local_a8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/JAJames[P]Jupiter-Bot/src/Jupiter/src/jessilib/src/test/object.cpp"
               ,500,(char *)CONCAT44(local_e8._4_4_,
                                     CONCAT22(local_e8._2_2_,CONCAT11(local_e8[1],local_e8[0]))));
    testing::internal::AssertHelper::operator=(local_a8,(Message *)&local_98);
    testing::internal::AssertHelper::~AssertHelper(local_a8);
    paVar2 = (anon_union_16_2_edb7204a_for_basic_string<char8_t,_std::char_traits<char8_t>,_std::allocator<char8_t>_>_11
              *)CONCAT44(local_e8._4_4_,CONCAT22(local_e8._2_2_,CONCAT11(local_e8[1],local_e8[0])));
    if (paVar2 != &local_d8) {
      operator_delete(paVar2,CONCAT71(local_d8._M_allocated_capacity._1_7_,local_d8._M_local_buf[0])
                             + 1);
    }
    plVar4 = (long *)CONCAT44(local_98._M_dataplus._M_p._4_4_,
                              CONCAT22(local_98._M_dataplus._M_p._2_2_,
                                       CONCAT11(local_98._M_dataplus._M_p._1_1_,
                                                local_98._M_dataplus._M_p._0_1_)));
    if (plVar4 != (long *)0x0) {
      (**(code **)(*plVar4 + 8))();
    }
    if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
        CONCAT62(uStack_be,uStack_c0) !=
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      std::
      default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    *)&uStack_c0,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   CONCAT62(uStack_be,uStack_c0));
    }
  }
  if (local_48 == '\x02') {
    uVar20 = CONCAT44(local_78._4_4_,CONCAT22(local_78._2_2_,local_78._0_2_));
  }
  else {
    uVar20 = 0;
  }
  local_c8[0] = SUB81(uVar20,0);
  local_c8[1] = (undefined1)((ulong)uVar20 >> 8);
  local_c8._2_2_ = (undefined2)((ulong)uVar20 >> 0x10);
  local_c8._4_4_ = (undefined4)((ulong)uVar20 >> 0x20);
  local_98._M_dataplus._M_p._0_1_ = 0;
  local_98._M_dataplus._M_p._1_1_ = 0;
  local_98._M_dataplus._M_p._2_2_ = 0;
  local_98._M_dataplus._M_p._4_4_ = 0;
  testing::internal::CmpHelperEQ<long_long,long_long>
            ((internal *)local_e8,"obj .get< long_long_t >()","long_long_t {}",(longlong *)local_c8,
             (longlong *)&local_98);
  if (local_e8[0] == (internal)0x0) {
    testing::Message::Message((Message *)local_c8);
    if ((undefined8 *)CONCAT62(uStack_de,uStack_e0) == (undefined8 *)0x0) {
      pcVar21 = "";
    }
    else {
      pcVar21 = *(char **)CONCAT62(uStack_de,uStack_e0);
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_98,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/JAJames[P]Jupiter-Bot/src/Jupiter/src/jessilib/src/test/object.cpp"
               ,500,pcVar21);
    testing::internal::AssertHelper::operator=((AssertHelper *)&local_98,(Message *)local_c8);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_98);
    plVar4 = (long *)CONCAT44(local_c8._4_4_,
                              CONCAT22(local_c8._2_2_,CONCAT11(local_c8[1],local_c8[0])));
    if (plVar4 != (long *)0x0) {
      (**(code **)(*plVar4 + 8))();
    }
  }
  if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
      CONCAT62(uStack_de,uStack_e0) !=
      (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&uStack_e0,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 CONCAT62(uStack_de,uStack_e0));
  }
  local_e8[0] = (internal)0x0;
  local_e8[1] = 0;
  local_e8._2_2_ = 0;
  local_e8._4_4_ = 0;
  std::
  variant<void*,bool,long,long_double,std::__cxx11::u8string,std::vector<unsigned_char,std::allocator<unsigned_char>>,std::vector<jessilib::object,std::allocator<jessilib::object>>,std::map<std::__cxx11::u8string,jessilib::object,std::less<std::__cxx11::u8string>,std::allocator<std::pair<std::__cxx11::u8string_const,jessilib::object>>>>
  ::emplace<2ul,long&>
            ((variant<void*,bool,long,long_double,std::__cxx11::u8string,std::vector<unsigned_char,std::allocator<unsigned_char>>,std::vector<jessilib::object,std::allocator<jessilib::object>>,std::map<std::__cxx11::u8string,jessilib::object,std::less<std::__cxx11::u8string>,std::allocator<std::pair<std::__cxx11::u8string_const,jessilib::object>>>>
              *)&local_78._M_first,(long *)local_e8);
  local_c8[0] = (Message)(local_48 == '\x02');
  uStack_c0 = 0;
  uStack_be = 0;
  if (!(bool)local_c8[0]) {
    testing::Message::Message((Message *)&local_98);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((AssertionResult *)local_e8,local_c8,"obj .has< intmax_t >()","false");
    testing::internal::AssertHelper::AssertHelper
              (local_a8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/JAJames[P]Jupiter-Bot/src/Jupiter/src/jessilib/src/test/object.cpp"
               ,0x1f5,(char *)CONCAT44(local_e8._4_4_,
                                       CONCAT22(local_e8._2_2_,CONCAT11(local_e8[1],local_e8[0]))));
    testing::internal::AssertHelper::operator=(local_a8,(Message *)&local_98);
    testing::internal::AssertHelper::~AssertHelper(local_a8);
    paVar2 = (anon_union_16_2_edb7204a_for_basic_string<char8_t,_std::char_traits<char8_t>,_std::allocator<char8_t>_>_11
              *)CONCAT44(local_e8._4_4_,CONCAT22(local_e8._2_2_,CONCAT11(local_e8[1],local_e8[0])));
    if (paVar2 != &local_d8) {
      operator_delete(paVar2,CONCAT71(local_d8._M_allocated_capacity._1_7_,local_d8._M_local_buf[0])
                             + 1);
    }
    plVar4 = (long *)CONCAT44(local_98._M_dataplus._M_p._4_4_,
                              CONCAT22(local_98._M_dataplus._M_p._2_2_,
                                       CONCAT11(local_98._M_dataplus._M_p._1_1_,
                                                local_98._M_dataplus._M_p._0_1_)));
    if (plVar4 != (long *)0x0) {
      (**(code **)(*plVar4 + 8))();
    }
    if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
        CONCAT62(uStack_be,uStack_c0) !=
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      std::
      default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    *)&uStack_c0,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   CONCAT62(uStack_be,uStack_c0));
    }
  }
  if (local_48 == '\x02') {
    uVar20 = CONCAT44(local_78._4_4_,CONCAT22(local_78._2_2_,local_78._0_2_));
  }
  else {
    uVar20 = 0;
  }
  local_c8[0] = SUB81(uVar20,0);
  local_c8[1] = (undefined1)((ulong)uVar20 >> 8);
  local_c8._2_2_ = (undefined2)((ulong)uVar20 >> 0x10);
  local_c8._4_4_ = (undefined4)((ulong)uVar20 >> 0x20);
  local_98._M_dataplus._M_p._0_1_ = 0;
  local_98._M_dataplus._M_p._1_1_ = 0;
  local_98._M_dataplus._M_p._2_2_ = 0;
  local_98._M_dataplus._M_p._4_4_ = 0;
  testing::internal::CmpHelperEQ<long,long>
            ((internal *)local_e8,"obj .get< intmax_t >()","intmax_t {}",(long *)local_c8,
             (long *)&local_98);
  if (local_e8[0] == (internal)0x0) {
    testing::Message::Message((Message *)local_c8);
    if ((undefined8 *)CONCAT62(uStack_de,uStack_e0) == (undefined8 *)0x0) {
      pcVar21 = "";
    }
    else {
      pcVar21 = *(char **)CONCAT62(uStack_de,uStack_e0);
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_98,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/JAJames[P]Jupiter-Bot/src/Jupiter/src/jessilib/src/test/object.cpp"
               ,0x1f5,pcVar21);
    testing::internal::AssertHelper::operator=((AssertHelper *)&local_98,(Message *)local_c8);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_98);
    plVar4 = (long *)CONCAT44(local_c8._4_4_,
                              CONCAT22(local_c8._2_2_,CONCAT11(local_c8[1],local_c8[0])));
    if (plVar4 != (long *)0x0) {
      (**(code **)(*plVar4 + 8))();
    }
  }
  if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
      CONCAT62(uStack_de,uStack_e0) !=
      (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&uStack_e0,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 CONCAT62(uStack_de,uStack_e0));
  }
  local_e8[0] = (internal)0x0;
  local_e8[1] = 0;
  local_e8._2_2_ = 0;
  std::
  variant<void*,bool,long,long_double,std::__cxx11::u8string,std::vector<unsigned_char,std::allocator<unsigned_char>>,std::vector<jessilib::object,std::allocator<jessilib::object>>,std::map<std::__cxx11::u8string,jessilib::object,std::less<std::__cxx11::u8string>,std::allocator<std::pair<std::__cxx11::u8string_const,jessilib::object>>>>
  ::emplace<3ul,float&>
            ((variant<void*,bool,long,long_double,std::__cxx11::u8string,std::vector<unsigned_char,std::allocator<unsigned_char>>,std::vector<jessilib::object,std::allocator<jessilib::object>>,std::map<std::__cxx11::u8string,jessilib::object,std::less<std::__cxx11::u8string>,std::allocator<std::pair<std::__cxx11::u8string_const,jessilib::object>>>>
              *)&local_78._M_first,(float *)local_e8);
  local_c8[0] = (Message)(local_48 == '\x03');
  uStack_c0 = 0;
  uStack_be = 0;
  if (!(bool)local_c8[0]) {
    testing::Message::Message((Message *)&local_98);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((AssertionResult *)local_e8,local_c8,"obj .has< float >()","false");
    testing::internal::AssertHelper::AssertHelper
              (local_a8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/JAJames[P]Jupiter-Bot/src/Jupiter/src/jessilib/src/test/object.cpp"
               ,0x1f6,(char *)CONCAT44(local_e8._4_4_,
                                       CONCAT22(local_e8._2_2_,CONCAT11(local_e8[1],local_e8[0]))));
    testing::internal::AssertHelper::operator=(local_a8,(Message *)&local_98);
    testing::internal::AssertHelper::~AssertHelper(local_a8);
    paVar2 = (anon_union_16_2_edb7204a_for_basic_string<char8_t,_std::char_traits<char8_t>,_std::allocator<char8_t>_>_11
              *)CONCAT44(local_e8._4_4_,CONCAT22(local_e8._2_2_,CONCAT11(local_e8[1],local_e8[0])));
    if (paVar2 != &local_d8) {
      operator_delete(paVar2,CONCAT71(local_d8._M_allocated_capacity._1_7_,local_d8._M_local_buf[0])
                             + 1);
    }
    plVar4 = (long *)CONCAT44(local_98._M_dataplus._M_p._4_4_,
                              CONCAT22(local_98._M_dataplus._M_p._2_2_,
                                       CONCAT11(local_98._M_dataplus._M_p._1_1_,
                                                local_98._M_dataplus._M_p._0_1_)));
    if (plVar4 != (long *)0x0) {
      (**(code **)(*plVar4 + 8))();
    }
    if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
        CONCAT62(uStack_be,uStack_c0) !=
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      std::
      default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    *)&uStack_c0,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   CONCAT62(uStack_be,uStack_c0));
    }
  }
  local_34 = (float)(longdouble)
                    CONCAT28(local_78._8_2_,
                             CONCAT44(local_78._4_4_,CONCAT22(local_78._2_2_,local_78._0_2_)));
  fVar23 = local_34;
  if (local_48 != '\x03') {
    fVar23 = 0.0;
  }
  local_c8[0] = SUB41(fVar23,0);
  local_c8[1] = (undefined1)((uint)fVar23 >> 8);
  local_c8._2_2_ = (undefined2)((uint)fVar23 >> 0x10);
  local_98._M_dataplus._M_p._0_1_ = 0;
  local_98._M_dataplus._M_p._1_1_ = 0;
  local_98._M_dataplus._M_p._2_2_ = 0;
  testing::internal::CmpHelperEQ<float,float>
            ((internal *)local_e8,"obj .get< float >()","float {}",(float *)local_c8,
             (float *)&local_98);
  if (local_e8[0] == (internal)0x0) {
    testing::Message::Message((Message *)local_c8);
    if ((undefined8 *)CONCAT62(uStack_de,uStack_e0) == (undefined8 *)0x0) {
      pcVar21 = "";
    }
    else {
      pcVar21 = *(char **)CONCAT62(uStack_de,uStack_e0);
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_98,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/JAJames[P]Jupiter-Bot/src/Jupiter/src/jessilib/src/test/object.cpp"
               ,0x1f6,pcVar21);
    testing::internal::AssertHelper::operator=((AssertHelper *)&local_98,(Message *)local_c8);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_98);
    plVar4 = (long *)CONCAT44(local_c8._4_4_,
                              CONCAT22(local_c8._2_2_,CONCAT11(local_c8[1],local_c8[0])));
    if (plVar4 != (long *)0x0) {
      (**(code **)(*plVar4 + 8))();
    }
  }
  if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
      CONCAT62(uStack_de,uStack_e0) !=
      (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&uStack_e0,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 CONCAT62(uStack_de,uStack_e0));
  }
  local_e8[0] = (internal)0x0;
  local_e8[1] = 0;
  local_e8._2_2_ = 0;
  local_e8._4_4_ = 0;
  std::
  variant<void*,bool,long,long_double,std::__cxx11::u8string,std::vector<unsigned_char,std::allocator<unsigned_char>>,std::vector<jessilib::object,std::allocator<jessilib::object>>,std::map<std::__cxx11::u8string,jessilib::object,std::less<std::__cxx11::u8string>,std::allocator<std::pair<std::__cxx11::u8string_const,jessilib::object>>>>
  ::emplace<3ul,double&>
            ((variant<void*,bool,long,long_double,std::__cxx11::u8string,std::vector<unsigned_char,std::allocator<unsigned_char>>,std::vector<jessilib::object,std::allocator<jessilib::object>>,std::map<std::__cxx11::u8string,jessilib::object,std::less<std::__cxx11::u8string>,std::allocator<std::pair<std::__cxx11::u8string_const,jessilib::object>>>>
              *)&local_78._M_first,(double *)local_e8);
  local_c8[0] = (Message)(local_48 == '\x03');
  uStack_c0 = 0;
  uStack_be = 0;
  if (!(bool)local_c8[0]) {
    testing::Message::Message((Message *)&local_98);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((AssertionResult *)local_e8,local_c8,"obj .has< double >()","false");
    testing::internal::AssertHelper::AssertHelper
              (local_a8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/JAJames[P]Jupiter-Bot/src/Jupiter/src/jessilib/src/test/object.cpp"
               ,0x1f7,(char *)CONCAT44(local_e8._4_4_,
                                       CONCAT22(local_e8._2_2_,CONCAT11(local_e8[1],local_e8[0]))));
    testing::internal::AssertHelper::operator=(local_a8,(Message *)&local_98);
    testing::internal::AssertHelper::~AssertHelper(local_a8);
    paVar2 = (anon_union_16_2_edb7204a_for_basic_string<char8_t,_std::char_traits<char8_t>,_std::allocator<char8_t>_>_11
              *)CONCAT44(local_e8._4_4_,CONCAT22(local_e8._2_2_,CONCAT11(local_e8[1],local_e8[0])));
    if (paVar2 != &local_d8) {
      operator_delete(paVar2,CONCAT71(local_d8._M_allocated_capacity._1_7_,local_d8._M_local_buf[0])
                             + 1);
    }
    plVar4 = (long *)CONCAT44(local_98._M_dataplus._M_p._4_4_,
                              CONCAT22(local_98._M_dataplus._M_p._2_2_,
                                       CONCAT11(local_98._M_dataplus._M_p._1_1_,
                                                local_98._M_dataplus._M_p._0_1_)));
    if (plVar4 != (long *)0x0) {
      (**(code **)(*plVar4 + 8))();
    }
    if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
        CONCAT62(uStack_be,uStack_c0) !=
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      std::
      default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    *)&uStack_c0,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   CONCAT62(uStack_be,uStack_c0));
    }
  }
  local_30 = (double)(longdouble)
                     CONCAT28(local_78._8_2_,
                              CONCAT44(local_78._4_4_,CONCAT22(local_78._2_2_,local_78._0_2_)));
  dVar7 = local_30;
  if (local_48 != '\x03') {
    dVar7 = 0.0;
  }
  local_c8._4_4_ = (undefined4)((ulong)dVar7 >> 0x20);
  local_c8[0] = SUB81(dVar7,0);
  local_c8[1] = (undefined1)((ulong)dVar7 >> 8);
  local_c8._2_2_ = (undefined2)((ulong)dVar7 >> 0x10);
  local_98._M_dataplus._M_p._0_1_ = 0;
  local_98._M_dataplus._M_p._1_1_ = 0;
  local_98._M_dataplus._M_p._2_2_ = 0;
  local_98._M_dataplus._M_p._4_4_ = 0;
  testing::internal::CmpHelperEQ<double,double>
            ((internal *)local_e8,"obj .get< double >()","double {}",(double *)local_c8,
             (double *)&local_98);
  if (local_e8[0] == (internal)0x0) {
    testing::Message::Message((Message *)local_c8);
    if ((undefined8 *)CONCAT62(uStack_de,uStack_e0) == (undefined8 *)0x0) {
      pcVar21 = "";
    }
    else {
      pcVar21 = *(char **)CONCAT62(uStack_de,uStack_e0);
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_98,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/JAJames[P]Jupiter-Bot/src/Jupiter/src/jessilib/src/test/object.cpp"
               ,0x1f7,pcVar21);
    testing::internal::AssertHelper::operator=((AssertHelper *)&local_98,(Message *)local_c8);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_98);
    plVar4 = (long *)CONCAT44(local_c8._4_4_,
                              CONCAT22(local_c8._2_2_,CONCAT11(local_c8[1],local_c8[0])));
    if (plVar4 != (long *)0x0) {
      (**(code **)(*plVar4 + 8))();
    }
  }
  if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
      CONCAT62(uStack_de,uStack_e0) !=
      (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&uStack_e0,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 CONCAT62(uStack_de,uStack_e0));
  }
  lVar1 = (longdouble)0;
  local_e8[0] = SUB101(lVar1,0);
  local_e8[1] = (undefined1)((unkuint10)lVar1 >> 8);
  local_e8._2_2_ = (undefined2)((unkuint10)lVar1 >> 0x10);
  local_e8._4_4_ = (undefined4)((unkuint10)lVar1 >> 0x20);
  uStack_e0 = (undefined2)((unkuint10)lVar1 >> 0x40);
  std::
  variant<void*,bool,long,long_double,std::__cxx11::u8string,std::vector<unsigned_char,std::allocator<unsigned_char>>,std::vector<jessilib::object,std::allocator<jessilib::object>>,std::map<std::__cxx11::u8string,jessilib::object,std::less<std::__cxx11::u8string>,std::allocator<std::pair<std::__cxx11::u8string_const,jessilib::object>>>>
  ::emplace<3ul,long_double&>
            ((variant<void*,bool,long,long_double,std::__cxx11::u8string,std::vector<unsigned_char,std::allocator<unsigned_char>>,std::vector<jessilib::object,std::allocator<jessilib::object>>,std::map<std::__cxx11::u8string,jessilib::object,std::less<std::__cxx11::u8string>,std::allocator<std::pair<std::__cxx11::u8string_const,jessilib::object>>>>
              *)&local_78._M_first,(longdouble *)local_e8);
  local_c8[0] = (Message)(local_48 == '\x03');
  uStack_c0 = 0;
  uStack_be = 0;
  if (!(bool)local_c8[0]) {
    testing::Message::Message((Message *)&local_98);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((AssertionResult *)local_e8,local_c8,"obj .has< long_double_t >()","false");
    testing::internal::AssertHelper::AssertHelper
              (local_a8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/JAJames[P]Jupiter-Bot/src/Jupiter/src/jessilib/src/test/object.cpp"
               ,0x1f8,(char *)CONCAT44(local_e8._4_4_,
                                       CONCAT22(local_e8._2_2_,CONCAT11(local_e8[1],local_e8[0]))));
    testing::internal::AssertHelper::operator=(local_a8,(Message *)&local_98);
    testing::internal::AssertHelper::~AssertHelper(local_a8);
    paVar2 = (anon_union_16_2_edb7204a_for_basic_string<char8_t,_std::char_traits<char8_t>,_std::allocator<char8_t>_>_11
              *)CONCAT44(local_e8._4_4_,CONCAT22(local_e8._2_2_,CONCAT11(local_e8[1],local_e8[0])));
    if (paVar2 != &local_d8) {
      operator_delete(paVar2,CONCAT71(local_d8._M_allocated_capacity._1_7_,local_d8._M_local_buf[0])
                             + 1);
    }
    plVar4 = (long *)CONCAT44(local_98._M_dataplus._M_p._4_4_,
                              CONCAT22(local_98._M_dataplus._M_p._2_2_,
                                       CONCAT11(local_98._M_dataplus._M_p._1_1_,
                                                local_98._M_dataplus._M_p._0_1_)));
    if (plVar4 != (long *)0x0) {
      (**(code **)(*plVar4 + 8))();
    }
    if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
        CONCAT62(uStack_be,uStack_c0) !=
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      std::
      default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    *)&uStack_c0,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   CONCAT62(uStack_be,uStack_c0));
    }
  }
  lVar1 = (longdouble)0;
  lVar22 = lVar1;
  if (local_48 == '\x03') {
    lVar22 = (longdouble)
             CONCAT28(local_78._8_2_,
                      CONCAT44(local_78._4_4_,CONCAT22(local_78._2_2_,local_78._0_2_)));
  }
  local_c8[0] = SUB101(lVar22,0);
  local_c8[1] = (undefined1)((unkuint10)lVar22 >> 8);
  local_c8._2_2_ = (undefined2)((unkuint10)lVar22 >> 0x10);
  local_c8._4_4_ = (undefined4)((unkuint10)lVar22 >> 0x20);
  uStack_c0 = (undefined2)((unkuint10)lVar22 >> 0x40);
  local_98._M_dataplus._M_p._0_1_ = SUB101(lVar1,0);
  local_98._M_dataplus._M_p._1_1_ = (undefined1)((unkuint10)lVar1 >> 8);
  local_98._M_dataplus._M_p._2_2_ = (undefined2)((unkuint10)lVar1 >> 0x10);
  local_98._M_dataplus._M_p._4_4_ = (undefined4)((unkuint10)lVar1 >> 0x20);
  local_98._M_string_length._0_2_ = (undefined2)((unkuint10)lVar1 >> 0x40);
  testing::internal::CmpHelperEQ<long_double,long_double>
            ((internal *)local_e8,"obj .get< long_double_t >()","long_double_t {}",
             (longdouble *)local_c8,(longdouble *)&local_98);
  if (local_e8[0] == (internal)0x0) {
    testing::Message::Message((Message *)local_c8);
    if ((undefined8 *)CONCAT62(uStack_de,uStack_e0) == (undefined8 *)0x0) {
      pcVar21 = "";
    }
    else {
      pcVar21 = *(char **)CONCAT62(uStack_de,uStack_e0);
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_98,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/JAJames[P]Jupiter-Bot/src/Jupiter/src/jessilib/src/test/object.cpp"
               ,0x1f8,pcVar21);
    testing::internal::AssertHelper::operator=((AssertHelper *)&local_98,(Message *)local_c8);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_98);
    plVar4 = (long *)CONCAT44(local_c8._4_4_,
                              CONCAT22(local_c8._2_2_,CONCAT11(local_c8[1],local_c8[0])));
    if (plVar4 != (long *)0x0) {
      (**(code **)(*plVar4 + 8))();
    }
  }
  if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
      CONCAT62(uStack_de,uStack_e0) !=
      (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&uStack_e0,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 CONCAT62(uStack_de,uStack_e0));
  }
  local_e8[0] = SUB81(&local_d8,0);
  iVar8 = local_e8[0];
  local_e8[1] = (undefined1)((ulong)&local_d8 >> 8);
  uVar9 = local_e8[1];
  local_e8._2_2_ = (undefined2)((ulong)&local_d8 >> 0x10);
  uVar18 = local_e8._2_2_;
  local_e8._4_4_ = (undefined4)((ulong)&local_d8 >> 0x20);
  uVar19 = local_e8._4_4_;
  uStack_e0 = 0;
  uStack_de = 0;
  local_d8._M_local_buf[0] = '\0';
  std::
  variant<void*,bool,long,long_double,std::__cxx11::u8string,std::vector<unsigned_char,std::allocator<unsigned_char>>,std::vector<jessilib::object,std::allocator<jessilib::object>>,std::map<std::__cxx11::u8string,jessilib::object,std::less<std::__cxx11::u8string>,std::allocator<std::pair<std::__cxx11::u8string_const,jessilib::object>>>>
  ::emplace<4ul,std::__cxx11::u8string>
            ((variant<void*,bool,long,long_double,std::__cxx11::u8string,std::vector<unsigned_char,std::allocator<unsigned_char>>,std::vector<jessilib::object,std::allocator<jessilib::object>>,std::map<std::__cxx11::u8string,jessilib::object,std::less<std::__cxx11::u8string>,std::allocator<std::pair<std::__cxx11::u8string_const,jessilib::object>>>>
              *)&local_78._M_first,
             (basic_string<char8_t,_std::char_traits<char8_t>,_std::allocator<char8_t>_> *)local_e8)
  ;
  paVar2 = (anon_union_16_2_edb7204a_for_basic_string<char8_t,_std::char_traits<char8_t>,_std::allocator<char8_t>_>_11
            *)CONCAT44(local_e8._4_4_,CONCAT22(local_e8._2_2_,CONCAT11(local_e8[1],local_e8[0])));
  if (paVar2 != &local_d8) {
    operator_delete(paVar2,CONCAT71(local_d8._M_allocated_capacity._1_7_,local_d8._M_local_buf[0]) +
                           1);
  }
  local_c8[0] = (Message)(local_48 == '\x04');
  uStack_c0 = 0;
  uStack_be = 0;
  if (!(bool)local_c8[0]) {
    testing::Message::Message((Message *)&local_98);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((AssertionResult *)local_e8,local_c8,"obj .has< std::u8string >()","false");
    testing::internal::AssertHelper::AssertHelper
              (local_a8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/JAJames[P]Jupiter-Bot/src/Jupiter/src/jessilib/src/test/object.cpp"
               ,0x1f9,(char *)CONCAT44(local_e8._4_4_,
                                       CONCAT22(local_e8._2_2_,CONCAT11(local_e8[1],local_e8[0]))));
    testing::internal::AssertHelper::operator=(local_a8,(Message *)&local_98);
    testing::internal::AssertHelper::~AssertHelper(local_a8);
    paVar2 = (anon_union_16_2_edb7204a_for_basic_string<char8_t,_std::char_traits<char8_t>,_std::allocator<char8_t>_>_11
              *)CONCAT44(local_e8._4_4_,CONCAT22(local_e8._2_2_,CONCAT11(local_e8[1],local_e8[0])));
    if (paVar2 != &local_d8) {
      operator_delete(paVar2,CONCAT71(local_d8._M_allocated_capacity._1_7_,local_d8._M_local_buf[0])
                             + 1);
    }
    plVar4 = (long *)CONCAT44(local_98._M_dataplus._M_p._4_4_,
                              CONCAT22(local_98._M_dataplus._M_p._2_2_,
                                       CONCAT11(local_98._M_dataplus._M_p._1_1_,
                                                local_98._M_dataplus._M_p._0_1_)));
    if (plVar4 != (long *)0x0) {
      (**(code **)(*plVar4 + 8))();
    }
    if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
        CONCAT62(uStack_be,uStack_c0) !=
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      std::
      default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    *)&uStack_c0,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   CONCAT62(uStack_be,uStack_c0));
    }
  }
  local_c8[0] = SUB81(&local_b8,0);
  MVar10 = local_c8[0];
  local_c8[1] = (undefined1)((ulong)&local_b8 >> 8);
  uVar11 = local_c8[1];
  local_c8._2_2_ = (undefined2)((ulong)&local_b8 >> 0x10);
  uVar12 = local_c8._2_2_;
  local_c8._4_4_ = (undefined4)((ulong)&local_b8 >> 0x20);
  uVar13 = local_c8._4_4_;
  uStack_c0 = 0;
  uStack_be = 0;
  local_b8 = 0;
  local_e8[0] = iVar8;
  local_e8[1] = uVar9;
  local_e8._2_2_ = uVar18;
  local_e8._4_4_ = uVar19;
  if (local_48 == '\x04') {
    lVar6 = CONCAT44(local_78._4_4_,CONCAT22(local_78._2_2_,local_78._0_2_));
    std::__cxx11::u8string::_M_construct<char8_t*>
              ((u8string *)local_e8,lVar6,CONCAT62(local_78._10_6_,local_78._8_2_) + lVar6);
  }
  else {
    local_d8._M_local_buf[0] = '\0';
    local_d8._M_allocated_capacity._1_7_ = uStack_b7;
    local_d8._9_4_ = uStack_af;
    local_d8._13_2_ = uStack_ab;
    local_d8._M_local_buf[0xf] = cStack_a9;
    uStack_e0 = 0;
    uStack_de = 0;
    uStack_c0 = 0;
    uStack_be = 0;
    local_b8 = 0;
  }
  paVar2 = &local_98.field_2;
  local_98._M_dataplus._M_p._0_1_ = SUB81(paVar2,0);
  uVar14 = local_98._M_dataplus._M_p._0_1_;
  local_98._M_dataplus._M_p._1_1_ = (undefined1)((ulong)paVar2 >> 8);
  uVar15 = local_98._M_dataplus._M_p._1_1_;
  local_98._M_dataplus._M_p._2_2_ = (undefined2)((ulong)paVar2 >> 0x10);
  uVar16 = local_98._M_dataplus._M_p._2_2_;
  local_98._M_dataplus._M_p._4_4_ = (undefined4)((ulong)paVar2 >> 0x20);
  uVar17 = local_98._M_dataplus._M_p._4_4_;
  local_98._M_string_length._0_2_ = 0;
  local_98._M_string_length._2_6_ = 0;
  local_98.field_2._M_allocated_capacity =
       local_98.field_2._M_allocated_capacity & 0xffffffffffffff00;
  testing::internal::CmpHelperEQ<std::__cxx11::u8string,std::__cxx11::u8string>
            ((internal *)local_a8,"obj .get< std::u8string >()","std::u8string {}",
             (basic_string<char8_t,_std::char_traits<char8_t>,_std::allocator<char8_t>_> *)local_e8,
             &local_98);
  puVar5 = (undefined1 *)
           CONCAT44(local_98._M_dataplus._M_p._4_4_,
                    CONCAT22(local_98._M_dataplus._M_p._2_2_,
                             CONCAT11(local_98._M_dataplus._M_p._1_1_,
                                      local_98._M_dataplus._M_p._0_1_)));
  if ((anon_union_16_2_edb7204a_for_basic_string<char8_t,_std::char_traits<char8_t>,_std::allocator<char8_t>_>_11
       *)puVar5 != paVar2) {
    operator_delete(puVar5,local_98.field_2._M_allocated_capacity + 1);
  }
  paVar3 = (anon_union_16_2_edb7204a_for_basic_string<char8_t,_std::char_traits<char8_t>,_std::allocator<char8_t>_>_11
            *)CONCAT44(local_e8._4_4_,CONCAT22(local_e8._2_2_,CONCAT11(local_e8[1],local_e8[0])));
  if (paVar3 != &local_d8) {
    operator_delete(paVar3,CONCAT71(local_d8._M_allocated_capacity._1_7_,local_d8._M_local_buf[0]) +
                           1);
  }
  puVar5 = (undefined1 *)
           CONCAT44(local_c8._4_4_,CONCAT22(local_c8._2_2_,CONCAT11(local_c8[1],local_c8[0])));
  if (puVar5 != &local_b8) {
    operator_delete(puVar5,CONCAT71(uStack_b7,local_b8) + 1);
  }
  if (local_a8[0] == (AssertHelper)0x0) {
    testing::Message::Message((Message *)local_e8);
    if (local_a0 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar21 = "";
    }
    else {
      pcVar21 = (local_a0->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)local_c8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/JAJames[P]Jupiter-Bot/src/Jupiter/src/jessilib/src/test/object.cpp"
               ,0x1f9,pcVar21);
    testing::internal::AssertHelper::operator=((AssertHelper *)local_c8,(Message *)local_e8);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)local_c8);
    plVar4 = (long *)CONCAT44(local_e8._4_4_,
                              CONCAT22(local_e8._2_2_,CONCAT11(local_e8[1],local_e8[0])));
    if (plVar4 != (long *)0x0) {
      (**(code **)(*plVar4 + 8))();
    }
  }
  if (local_a0 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&local_a0,local_a0);
  }
  local_e8[0] = (internal)0x0;
  local_e8[1] = 0;
  local_e8._2_2_ = 0;
  local_e8._4_4_ = 0;
  uStack_e0 = 0;
  uStack_de = 0;
  local_d8._M_local_buf[0] = '\0';
  local_d8._M_allocated_capacity._1_7_ = 0;
  std::
  variant<void*,bool,long,long_double,std::__cxx11::u8string,std::vector<unsigned_char,std::allocator<unsigned_char>>,std::vector<jessilib::object,std::allocator<jessilib::object>>,std::map<std::__cxx11::u8string,jessilib::object,std::less<std::__cxx11::u8string>,std::allocator<std::pair<std::__cxx11::u8string_const,jessilib::object>>>>
  ::emplace<6ul,std::vector<jessilib::object,std::allocator<jessilib::object>>>
            ((variant<void*,bool,long,long_double,std::__cxx11::u8string,std::vector<unsigned_char,std::allocator<unsigned_char>>,std::vector<jessilib::object,std::allocator<jessilib::object>>,std::map<std::__cxx11::u8string,jessilib::object,std::less<std::__cxx11::u8string>,std::allocator<std::pair<std::__cxx11::u8string_const,jessilib::object>>>>
              *)&local_78._M_first,
             (vector<jessilib::object,_std::allocator<jessilib::object>_> *)local_e8);
  std::vector<jessilib::object,_std::allocator<jessilib::object>_>::~vector
            ((vector<jessilib::object,_std::allocator<jessilib::object>_> *)local_e8);
  local_c8[0] = (Message)(local_48 == '\x06');
  uStack_c0 = 0;
  uStack_be = 0;
  if (!(bool)local_c8[0]) {
    testing::Message::Message((Message *)&local_98);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((AssertionResult *)local_e8,local_c8,"obj .has< object::array_type >()","false");
    testing::internal::AssertHelper::AssertHelper
              (local_a8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/JAJames[P]Jupiter-Bot/src/Jupiter/src/jessilib/src/test/object.cpp"
               ,0x1fa,(char *)CONCAT44(local_e8._4_4_,
                                       CONCAT22(local_e8._2_2_,CONCAT11(local_e8[1],local_e8[0]))));
    testing::internal::AssertHelper::operator=(local_a8,(Message *)&local_98);
    testing::internal::AssertHelper::~AssertHelper(local_a8);
    paVar3 = (anon_union_16_2_edb7204a_for_basic_string<char8_t,_std::char_traits<char8_t>,_std::allocator<char8_t>_>_11
              *)CONCAT44(local_e8._4_4_,CONCAT22(local_e8._2_2_,CONCAT11(local_e8[1],local_e8[0])));
    if (paVar3 != &local_d8) {
      operator_delete(paVar3,CONCAT71(local_d8._M_allocated_capacity._1_7_,local_d8._M_local_buf[0])
                             + 1);
    }
    plVar4 = (long *)CONCAT44(local_98._M_dataplus._M_p._4_4_,
                              CONCAT22(local_98._M_dataplus._M_p._2_2_,
                                       CONCAT11(local_98._M_dataplus._M_p._1_1_,
                                                local_98._M_dataplus._M_p._0_1_)));
    if (plVar4 != (long *)0x0) {
      (**(code **)(*plVar4 + 8))();
    }
    if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
        CONCAT62(uStack_be,uStack_c0) !=
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      std::
      default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    *)&uStack_c0,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   CONCAT62(uStack_be,uStack_c0));
    }
  }
  local_c8[0] = (Message)0x0;
  local_c8[1] = 0;
  local_c8._2_2_ = 0;
  local_c8._4_4_ = 0;
  uStack_c0 = 0;
  uStack_be = 0;
  local_b8 = 0;
  uStack_b7 = 0;
  if (local_48 == '\x06') {
    std::vector<jessilib::object,_std::allocator<jessilib::object>_>::vector
              ((vector<jessilib::object,_std::allocator<jessilib::object>_> *)local_e8,
               (vector<jessilib::object,_std::allocator<jessilib::object>_> *)&local_78._M_first);
  }
  else {
    local_e8[0] = (internal)0x0;
    local_e8[1] = 0;
    local_e8._2_2_ = 0;
    local_e8._4_4_ = 0;
    uStack_e0 = 0;
    uStack_de = 0;
    local_d8._M_local_buf[0] = '\0';
    local_d8._M_allocated_capacity._1_7_ = 0;
    local_c8[0] = (Message)0x0;
    local_c8[1] = 0;
    local_c8._2_2_ = 0;
    local_c8._4_4_ = 0;
    uStack_c0 = 0;
    uStack_be = 0;
    local_b8 = 0;
    uStack_b7 = 0;
  }
  local_98._M_dataplus._M_p._0_1_ = 0;
  local_98._M_dataplus._M_p._1_1_ = 0;
  local_98._M_dataplus._M_p._2_2_ = 0;
  local_98._M_dataplus._M_p._4_4_ = 0;
  local_98._M_string_length._0_2_ = 0;
  local_98._M_string_length._2_6_ = 0;
  local_98.field_2._M_allocated_capacity = 0;
  testing::internal::
  CmpHelperEQ<std::vector<jessilib::object,std::allocator<jessilib::object>>,std::vector<jessilib::object,std::allocator<jessilib::object>>>
            ((internal *)local_a8,"obj .get< object::array_type >()","object::array_type {}",
             (vector<jessilib::object,_std::allocator<jessilib::object>_> *)local_e8,
             (vector<jessilib::object,_std::allocator<jessilib::object>_> *)&local_98);
  std::vector<jessilib::object,_std::allocator<jessilib::object>_>::~vector
            ((vector<jessilib::object,_std::allocator<jessilib::object>_> *)&local_98);
  std::vector<jessilib::object,_std::allocator<jessilib::object>_>::~vector
            ((vector<jessilib::object,_std::allocator<jessilib::object>_> *)local_e8);
  std::vector<jessilib::object,_std::allocator<jessilib::object>_>::~vector
            ((vector<jessilib::object,_std::allocator<jessilib::object>_> *)local_c8);
  if (local_a8[0] == (AssertHelper)0x0) {
    testing::Message::Message((Message *)local_e8);
    if (local_a0 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar21 = "";
    }
    else {
      pcVar21 = (local_a0->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)local_c8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/JAJames[P]Jupiter-Bot/src/Jupiter/src/jessilib/src/test/object.cpp"
               ,0x1fa,pcVar21);
    testing::internal::AssertHelper::operator=((AssertHelper *)local_c8,(Message *)local_e8);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)local_c8);
    plVar4 = (long *)CONCAT44(local_e8._4_4_,
                              CONCAT22(local_e8._2_2_,CONCAT11(local_e8[1],local_e8[0])));
    if (plVar4 != (long *)0x0) {
      (**(code **)(*plVar4 + 8))();
    }
  }
  if (local_a0 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&local_a0,local_a0);
  }
  pcVar21 = "";
  std::
  variant<void*,bool,long,long_double,std::__cxx11::u8string,std::vector<unsigned_char,std::allocator<unsigned_char>>,std::vector<jessilib::object,std::allocator<jessilib::object>>,std::map<std::__cxx11::u8string,jessilib::object,std::less<std::__cxx11::u8string>,std::allocator<std::pair<std::__cxx11::u8string_const,jessilib::object>>>>
  ::emplace<4ul,char8_t_const(&)[1]>
            ((variant<void*,bool,long,long_double,std::__cxx11::u8string,std::vector<unsigned_char,std::allocator<unsigned_char>>,std::vector<jessilib::object,std::allocator<jessilib::object>>,std::map<std::__cxx11::u8string,jessilib::object,std::less<std::__cxx11::u8string>,std::allocator<std::pair<std::__cxx11::u8string_const,jessilib::object>>>>
              *)&local_78._M_first,(char8_t (*) [1])0x486773);
  local_c8[0] = (Message)(local_48 == '\x04');
  uStack_c0 = 0;
  uStack_be = 0;
  if (!(bool)local_c8[0]) {
    testing::Message::Message((Message *)&local_98);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((AssertionResult *)local_e8,local_c8,"obj.has<std::u8string>()","false");
    testing::internal::AssertHelper::AssertHelper
              (local_a8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/JAJames[P]Jupiter-Bot/src/Jupiter/src/jessilib/src/test/object.cpp"
               ,0x1fe,(char *)CONCAT44(local_e8._4_4_,
                                       CONCAT22(local_e8._2_2_,CONCAT11(local_e8[1],local_e8[0]))));
    testing::internal::AssertHelper::operator=(local_a8,(Message *)&local_98);
    testing::internal::AssertHelper::~AssertHelper(local_a8);
    paVar3 = (anon_union_16_2_edb7204a_for_basic_string<char8_t,_std::char_traits<char8_t>,_std::allocator<char8_t>_>_11
              *)CONCAT44(local_e8._4_4_,CONCAT22(local_e8._2_2_,CONCAT11(local_e8[1],local_e8[0])));
    if (paVar3 != &local_d8) {
      operator_delete(paVar3,CONCAT71(local_d8._M_allocated_capacity._1_7_,local_d8._M_local_buf[0])
                             + 1);
    }
    plVar4 = (long *)CONCAT44(local_98._M_dataplus._M_p._4_4_,
                              CONCAT22(local_98._M_dataplus._M_p._2_2_,
                                       CONCAT11(local_98._M_dataplus._M_p._1_1_,
                                                local_98._M_dataplus._M_p._0_1_)));
    if (plVar4 != (long *)0x0) {
      (**(code **)(*plVar4 + 8))();
    }
    if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
        CONCAT62(uStack_be,uStack_c0) !=
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      std::
      default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    *)&uStack_c0,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   CONCAT62(uStack_be,uStack_c0));
    }
  }
  uStack_c0 = 0;
  uStack_be = 0;
  local_b8 = 0;
  local_c8[0] = MVar10;
  local_c8[1] = uVar11;
  local_c8._2_2_ = uVar12;
  local_c8._4_4_ = uVar13;
  if (local_48 == '\x04') {
    lVar6 = CONCAT44(local_78._4_4_,CONCAT22(local_78._2_2_,local_78._0_2_));
    local_e8[0] = iVar8;
    local_e8[1] = uVar9;
    local_e8._2_2_ = uVar18;
    local_e8._4_4_ = uVar19;
    std::__cxx11::u8string::_M_construct<char8_t*>
              ((u8string *)local_e8,lVar6,CONCAT62(local_78._10_6_,local_78._8_2_) + lVar6);
  }
  else {
    local_d8._M_local_buf[0] = '\0';
    local_d8._M_allocated_capacity._1_7_ = uStack_b7;
    local_d8._9_4_ = uStack_af;
    local_d8._13_2_ = uStack_ab;
    local_d8._M_local_buf[0xf] = cStack_a9;
    uStack_e0 = 0;
    uStack_de = 0;
    uStack_c0 = 0;
    uStack_be = 0;
    local_b8 = 0;
    local_e8[0] = iVar8;
    local_e8[1] = uVar9;
    local_e8._2_2_ = uVar18;
    local_e8._4_4_ = uVar19;
  }
  local_98._M_string_length._0_2_ = 0;
  local_98._M_string_length._2_6_ = 0;
  local_98.field_2._M_allocated_capacity =
       local_98.field_2._M_allocated_capacity & 0xffffffffffffff00;
  local_98._M_dataplus._M_p._0_1_ = uVar14;
  local_98._M_dataplus._M_p._1_1_ = uVar15;
  local_98._M_dataplus._M_p._2_2_ = uVar16;
  local_98._M_dataplus._M_p._4_4_ = uVar17;
  testing::internal::CmpHelperEQ<std::__cxx11::u8string,std::__cxx11::u8string>
            ((internal *)local_a8,"obj.get<std::u8string>()","std::u8string{}",
             (basic_string<char8_t,_std::char_traits<char8_t>,_std::allocator<char8_t>_> *)local_e8,
             &local_98);
  puVar5 = (undefined1 *)
           CONCAT44(local_98._M_dataplus._M_p._4_4_,
                    CONCAT22(local_98._M_dataplus._M_p._2_2_,
                             CONCAT11(local_98._M_dataplus._M_p._1_1_,
                                      local_98._M_dataplus._M_p._0_1_)));
  if ((anon_union_16_2_edb7204a_for_basic_string<char8_t,_std::char_traits<char8_t>,_std::allocator<char8_t>_>_11
       *)puVar5 != paVar2) {
    operator_delete(puVar5,local_98.field_2._M_allocated_capacity + 1);
  }
  paVar3 = (anon_union_16_2_edb7204a_for_basic_string<char8_t,_std::char_traits<char8_t>,_std::allocator<char8_t>_>_11
            *)CONCAT44(local_e8._4_4_,CONCAT22(local_e8._2_2_,CONCAT11(local_e8[1],local_e8[0])));
  if (paVar3 != &local_d8) {
    operator_delete(paVar3,CONCAT71(local_d8._M_allocated_capacity._1_7_,local_d8._M_local_buf[0]) +
                           1);
  }
  puVar5 = (undefined1 *)
           CONCAT44(local_c8._4_4_,CONCAT22(local_c8._2_2_,CONCAT11(local_c8[1],local_c8[0])));
  if (puVar5 != &local_b8) {
    operator_delete(puVar5,CONCAT71(uStack_b7,local_b8) + 1);
  }
  if (local_a8[0] == (AssertHelper)0x0) {
    testing::Message::Message((Message *)local_e8);
    if (local_a0 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar21 = (local_a0->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)local_c8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/JAJames[P]Jupiter-Bot/src/Jupiter/src/jessilib/src/test/object.cpp"
               ,0x1ff,pcVar21);
    testing::internal::AssertHelper::operator=((AssertHelper *)local_c8,(Message *)local_e8);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)local_c8);
    plVar4 = (long *)CONCAT44(local_e8._4_4_,
                              CONCAT22(local_e8._2_2_,CONCAT11(local_e8[1],local_e8[0])));
    if (plVar4 != (long *)0x0) {
      (**(code **)(*plVar4 + 8))();
    }
  }
  if (local_a0 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&local_a0,local_a0);
  }
  pcVar21 = "";
  local_e8[0] = (internal)0x73;
  local_e8[1] = 0x67;
  local_e8._2_2_ = 0x48;
  local_e8._4_4_ = 0;
  local_c8[0] = (Message)0x73;
  local_c8[1] = 0x67;
  local_c8._2_2_ = 0x48;
  local_c8._4_4_ = 0;
  std::
  variant<void*,bool,long,long_double,std::__cxx11::u8string,std::vector<unsigned_char,std::allocator<unsigned_char>>,std::vector<jessilib::object,std::allocator<jessilib::object>>,std::map<std::__cxx11::u8string,jessilib::object,std::less<std::__cxx11::u8string>,std::allocator<std::pair<std::__cxx11::u8string_const,jessilib::object>>>>
  ::emplace<4ul,char8_t_const*,char8_t_const*>
            ((variant<void*,bool,long,long_double,std::__cxx11::u8string,std::vector<unsigned_char,std::allocator<unsigned_char>>,std::vector<jessilib::object,std::allocator<jessilib::object>>,std::map<std::__cxx11::u8string,jessilib::object,std::less<std::__cxx11::u8string>,std::allocator<std::pair<std::__cxx11::u8string_const,jessilib::object>>>>
              *)&local_78._M_first,(char8_t **)local_e8,(char8_t **)local_c8);
  local_c8[0] = (Message)(local_48 == '\x04');
  uStack_c0 = 0;
  uStack_be = 0;
  if (!(bool)local_c8[0]) {
    testing::Message::Message((Message *)&local_98);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((AssertionResult *)local_e8,local_c8,"obj.has<std::u8string>()","false");
    testing::internal::AssertHelper::AssertHelper
              (local_a8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/JAJames[P]Jupiter-Bot/src/Jupiter/src/jessilib/src/test/object.cpp"
               ,0x203,(char *)CONCAT44(local_e8._4_4_,
                                       CONCAT22(local_e8._2_2_,CONCAT11(local_e8[1],local_e8[0]))));
    testing::internal::AssertHelper::operator=(local_a8,(Message *)&local_98);
    testing::internal::AssertHelper::~AssertHelper(local_a8);
    paVar3 = (anon_union_16_2_edb7204a_for_basic_string<char8_t,_std::char_traits<char8_t>,_std::allocator<char8_t>_>_11
              *)CONCAT44(local_e8._4_4_,CONCAT22(local_e8._2_2_,CONCAT11(local_e8[1],local_e8[0])));
    if (paVar3 != &local_d8) {
      operator_delete(paVar3,CONCAT71(local_d8._M_allocated_capacity._1_7_,local_d8._M_local_buf[0])
                             + 1);
    }
    plVar4 = (long *)CONCAT44(local_98._M_dataplus._M_p._4_4_,
                              CONCAT22(local_98._M_dataplus._M_p._2_2_,
                                       CONCAT11(local_98._M_dataplus._M_p._1_1_,
                                                local_98._M_dataplus._M_p._0_1_)));
    if (plVar4 != (long *)0x0) {
      (**(code **)(*plVar4 + 8))();
    }
    if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
        CONCAT62(uStack_be,uStack_c0) !=
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      std::
      default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    *)&uStack_c0,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   CONCAT62(uStack_be,uStack_c0));
    }
  }
  uStack_c0 = 0;
  uStack_be = 0;
  local_b8 = 0;
  if (local_48 == '\x04') {
    lVar6 = CONCAT44(local_78._4_4_,CONCAT22(local_78._2_2_,local_78._0_2_));
    local_e8[0] = iVar8;
    local_e8[1] = uVar9;
    local_e8._2_2_ = uVar18;
    local_e8._4_4_ = uVar19;
    local_c8[0] = MVar10;
    local_c8[1] = uVar11;
    local_c8._2_2_ = uVar12;
    local_c8._4_4_ = uVar13;
    std::__cxx11::u8string::_M_construct<char8_t*>
              ((u8string *)local_e8,lVar6,CONCAT62(local_78._10_6_,local_78._8_2_) + lVar6);
  }
  else {
    local_d8._M_local_buf[0] = '\0';
    local_d8._M_allocated_capacity._1_7_ = uStack_b7;
    local_d8._9_4_ = uStack_af;
    local_d8._13_2_ = uStack_ab;
    local_d8._M_local_buf[0xf] = cStack_a9;
    uStack_e0 = 0;
    uStack_de = 0;
    uStack_c0 = 0;
    uStack_be = 0;
    local_b8 = 0;
    local_e8[0] = iVar8;
    local_e8[1] = uVar9;
    local_e8._2_2_ = uVar18;
    local_e8._4_4_ = uVar19;
    local_c8[0] = MVar10;
    local_c8[1] = uVar11;
    local_c8._2_2_ = uVar12;
    local_c8._4_4_ = uVar13;
  }
  local_98._M_string_length._0_2_ = 0;
  local_98._M_string_length._2_6_ = 0;
  local_98.field_2._M_allocated_capacity =
       local_98.field_2._M_allocated_capacity & 0xffffffffffffff00;
  local_98._M_dataplus._M_p._0_1_ = uVar14;
  local_98._M_dataplus._M_p._1_1_ = uVar15;
  local_98._M_dataplus._M_p._2_2_ = uVar16;
  local_98._M_dataplus._M_p._4_4_ = uVar17;
  testing::internal::CmpHelperEQ<std::__cxx11::u8string,std::__cxx11::u8string>
            ((internal *)local_a8,"obj.get<std::u8string>()","std::u8string{}",
             (basic_string<char8_t,_std::char_traits<char8_t>,_std::allocator<char8_t>_> *)local_e8,
             &local_98);
  puVar5 = (undefined1 *)
           CONCAT44(local_98._M_dataplus._M_p._4_4_,
                    CONCAT22(local_98._M_dataplus._M_p._2_2_,
                             CONCAT11(local_98._M_dataplus._M_p._1_1_,
                                      local_98._M_dataplus._M_p._0_1_)));
  if ((anon_union_16_2_edb7204a_for_basic_string<char8_t,_std::char_traits<char8_t>,_std::allocator<char8_t>_>_11
       *)puVar5 != paVar2) {
    operator_delete(puVar5,local_98.field_2._M_allocated_capacity + 1);
  }
  paVar2 = (anon_union_16_2_edb7204a_for_basic_string<char8_t,_std::char_traits<char8_t>,_std::allocator<char8_t>_>_11
            *)CONCAT44(local_e8._4_4_,CONCAT22(local_e8._2_2_,CONCAT11(local_e8[1],local_e8[0])));
  if (paVar2 != &local_d8) {
    operator_delete(paVar2,CONCAT71(local_d8._M_allocated_capacity._1_7_,local_d8._M_local_buf[0]) +
                           1);
  }
  puVar5 = (undefined1 *)
           CONCAT44(local_c8._4_4_,CONCAT22(local_c8._2_2_,CONCAT11(local_c8[1],local_c8[0])));
  if (puVar5 != &local_b8) {
    operator_delete(puVar5,CONCAT71(uStack_b7,local_b8) + 1);
  }
  if (local_a8[0] == (AssertHelper)0x0) {
    testing::Message::Message((Message *)local_e8);
    if (local_a0 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar21 = (local_a0->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)local_c8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/JAJames[P]Jupiter-Bot/src/Jupiter/src/jessilib/src/test/object.cpp"
               ,0x204,pcVar21);
    testing::internal::AssertHelper::operator=((AssertHelper *)local_c8,(Message *)local_e8);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)local_c8);
    plVar4 = (long *)CONCAT44(local_e8._4_4_,
                              CONCAT22(local_e8._2_2_,CONCAT11(local_e8[1],local_e8[0])));
    if (plVar4 != (long *)0x0) {
      (**(code **)(*plVar4 + 8))();
    }
  }
  if (local_a0 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&local_a0,local_a0);
  }
  std::__detail::__variant::
  _Variant_storage<false,_void_*,_bool,_long,_long_double,_std::__cxx11::basic_string<char8_t,_std::char_traits<char8_t>,_std::allocator<char8_t>_>,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::vector<jessilib::object,_std::allocator<jessilib::object>_>,_std::map<std::__cxx11::basic_string<char8_t,_std::char_traits<char8_t>,_std::allocator<char8_t>_>,_jessilib::object,_std::less<std::__cxx11::basic_string<char8_t,_std::char_traits<char8_t>,_std::allocator<char8_t>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char8_t,_std::char_traits<char8_t>,_std::allocator<char8_t>_>,_jessilib::object>_>_>_>
  ::~_Variant_storage((_Variant_storage<false,_void_*,_bool,_long,_long_double,_std::__cxx11::basic_string<char8_t,_std::char_traits<char8_t>,_std::allocator<char8_t>_>,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::vector<jessilib::object,_std::allocator<jessilib::object>_>,_std::map<std::__cxx11::basic_string<char8_t,_std::char_traits<char8_t>,_std::allocator<char8_t>_>,_jessilib::object,_std::less<std::__cxx11::basic_string<char8_t,_std::char_traits<char8_t>,_std::allocator<char8_t>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char8_t,_std::char_traits<char8_t>,_std::allocator<char8_t>_>,_jessilib::object>_>_>_>
                       *)&local_78._M_first);
  return;
}

Assistant:

TEST(ObjectTest, basic_set) {
	object obj;

	OBJECT_BASIC_SET_TEST(obj, bool);
	OBJECT_BASIC_SET_TEST(obj, signed_char_t);
	OBJECT_BASIC_SET_TEST(obj, unsigned_char_t);
	OBJECT_BASIC_SET_TEST(obj, short);
	OBJECT_BASIC_SET_TEST(obj, int);
	OBJECT_BASIC_SET_TEST(obj, long);
	OBJECT_BASIC_SET_TEST(obj, long_long_t);
	OBJECT_BASIC_SET_TEST(obj, intmax_t);
	OBJECT_BASIC_SET_TEST(obj, float);
	OBJECT_BASIC_SET_TEST(obj, double);
	OBJECT_BASIC_SET_TEST(obj, long_double_t);
	OBJECT_BASIC_SET_TEST(obj, std::u8string);
	OBJECT_BASIC_SET_TEST(obj, object::array_type);

	// const char*
	obj.set(u8"");
	EXPECT_TRUE(obj.has<std::u8string>());
	EXPECT_EQ(obj.get<std::u8string>(), std::u8string{});

	// std::u8string_view
	obj.set(u8""sv);
	EXPECT_TRUE(obj.has<std::u8string>());
	EXPECT_EQ(obj.get<std::u8string>(), std::u8string{});
}